

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void StripOnlyChild(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node **ppNVar3;
  
  pNVar1 = node->content;
  pNVar2 = pNVar1->last;
  node->content = pNVar1->content;
  node->last = pNVar2;
  pNVar1->content = (Node *)0x0;
  prvTidyFreeNode(doc,pNVar1);
  ppNVar3 = &node->content;
  while (pNVar1 = *ppNVar3, pNVar1 != (Node *)0x0) {
    pNVar1->parent = node;
    ppNVar3 = &pNVar1->next;
  }
  return;
}

Assistant:

static void StripOnlyChild(TidyDocImpl* doc, Node *node)
{
    Node *child;

    child = node->content;
    node->content = child->content;
    node->last = child->last;
    child->content = NULL;
    TY_(FreeNode)(doc, child);

    for (child = node->content; child; child = child->next)
        child->parent = node;
}